

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

void gdImageDestroy(gdImagePtr im)

{
  uchar **ptr;
  int **ptr_00;
  long lVar1;
  
  ptr = im->pixels;
  if (ptr != (uchar **)0x0) {
    if (0 < im->sy) {
      lVar1 = 0;
      do {
        gdFree(im->pixels[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < im->sy);
      ptr = im->pixels;
    }
    gdFree(ptr);
  }
  ptr_00 = im->tpixels;
  if (ptr_00 != (int **)0x0) {
    if (0 < im->sy) {
      lVar1 = 0;
      do {
        gdFree(im->tpixels[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < im->sy);
      ptr_00 = im->tpixels;
    }
    gdFree(ptr_00);
  }
  if (im->polyInts != (int *)0x0) {
    gdFree(im->polyInts);
  }
  if (im->style != (int *)0x0) {
    gdFree(im->style);
  }
  gdFree(im);
  return;
}

Assistant:

BGD_DECLARE(void) gdImageDestroy (gdImagePtr im)
{
	int i;
	if (im->pixels) {
		for (i = 0; (i < im->sy); i++) {
			gdFree (im->pixels[i]);
		}
		gdFree (im->pixels);
	}
	if (im->tpixels) {
		for (i = 0; (i < im->sy); i++) {
			gdFree (im->tpixels[i]);
		}
		gdFree (im->tpixels);
	}
	if (im->polyInts) {
		gdFree (im->polyInts);
	}
	if (im->style) {
		gdFree (im->style);
	}
	gdFree (im);
}